

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::compute_hash_stage
               (StateRecorder *recorder,Hasher *h,VkPipelineShaderStageCreateInfo *stage)

{
  bool bVar1;
  VkShaderModuleCreateInfo *create_info;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *identifier;
  VkShaderModuleCreateInfo *module;
  Hash hash;
  VkPipelineShaderStageCreateInfo *stage_local;
  Hasher *h_local;
  StateRecorder *recorder_local;
  
  if (stage->pName == (char *)0x0) {
    return false;
  }
  hash = (Hash)stage;
  stage_local = (VkPipelineShaderStageCreateInfo *)h;
  h_local = (Hasher *)recorder;
  Hasher::u32(h,stage->flags);
  Hasher::string((Hasher *)stage_local,*(char **)(hash + 0x20));
  Hasher::u32((Hasher *)stage_local,*(uint32_t *)(hash + 0x14));
  if (*(long *)(hash + 0x18) == 0) {
    create_info = find_pnext<VkShaderModuleCreateInfo>
                            (VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO,*(void **)(hash + 8));
    if (create_info == (VkShaderModuleCreateInfo *)0x0) {
      info = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>
                       (VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT,
                        *(void **)(hash + 8));
      if (info == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
        return false;
      }
      bVar1 = StateRecorder::get_hash_for_shader_module
                        ((StateRecorder *)h_local,info,(Hash *)&module);
      if (!bVar1) {
        return false;
      }
    }
    else {
      bVar1 = compute_hash_shader_module(create_info,(Hash *)&module);
      if (!bVar1) {
        return false;
      }
    }
  }
  else {
    bVar1 = StateRecorder::get_hash_for_shader_module
                      ((StateRecorder *)h_local,*(VkShaderModule *)(hash + 0x18),(Hash *)&module);
    if (!bVar1) {
      return false;
    }
  }
  Hasher::u64((Hasher *)stage_local,(uint64_t)module);
  if (*(long *)(hash + 0x28) == 0) {
    Hasher::u32((Hasher *)stage_local,0);
  }
  else {
    hash_specialization_info((Hasher *)stage_local,*(VkSpecializationInfo **)(hash + 0x28));
  }
  bVar1 = hash_pnext_chain((StateRecorder *)h_local,(Hasher *)stage_local,*(void **)(hash + 8),
                           (DynamicStateInfo *)0x0,0);
  return bVar1;
}

Assistant:

static bool compute_hash_stage(const StateRecorder &recorder, Hasher &h, const VkPipelineShaderStageCreateInfo &stage)
{
	if (!stage.pName)
		return false;

	h.u32(stage.flags);
	h.string(stage.pName);
	h.u32(stage.stage);

	Hash hash;
	if (stage.module != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_shader_module(stage.module, &hash))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, stage.pNext))
	{
		if (!compute_hash_shader_module(*module, &hash))
			return false;
	}
	else if (const auto *identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, stage.pNext))
	{
		if (!recorder.get_hash_for_shader_module(identifier, &hash))
			return false;
	}
	else
		return false;

	h.u64(hash);

	if (stage.pSpecializationInfo)
		hash_specialization_info(h, *stage.pSpecializationInfo);
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, stage.pNext, nullptr, 0))
		return false;

	return true;
}